

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

void __thiscall
chaiscript::Boxed_Value::Boxed_Value<std::__cxx11::string&,void>
          (Boxed_Value *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
          bool t_return_value)

{
  byte in_DL;
  string *in_RSI;
  bool in_stack_00000017;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  string local_38 [39];
  byte local_11;
  
  local_11 = in_DL & 1;
  std::__cxx11::string::string(local_38,in_RSI);
  Object_Data::get<std::__cxx11::string>(in_stack_00000018,in_stack_00000017);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

explicit Boxed_Value(T &&t, bool t_return_value = false)
          : m_data(Object_Data::get(std::forward<T>(t), t_return_value))
        {
        }